

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O3

bool __thiscall
duckdb::LocalFileSystem::ListFiles
          (LocalFileSystem *this,string *directory,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
          *callback,FileOpener *opener)

{
  pointer pcVar1;
  int iVar2;
  idx_t iVar3;
  DIR *__dirp;
  dirent *pdVar4;
  size_t sVar5;
  string full_path;
  string name;
  stat status;
  allocator local_141;
  _Any_data *local_140;
  FileSystem *local_138;
  char *local_130;
  string local_128;
  string local_108;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  DIR *local_c8;
  stat local_c0;
  
  pcVar1 = (directory->_M_dataplus)._M_p;
  local_140 = (_Any_data *)callback;
  local_138 = &this->super_FileSystem;
  iVar3 = GetFileUrlOffset(directory);
  local_130 = pcVar1 + iVar3;
  __dirp = opendir(local_130);
  if (__dirp != (DIR *)0x0) {
    local_e8._M_unused._M_object = (void *)0x0;
    local_e8._8_8_ = 0;
    local_d0 = std::
               _Function_handler<void_(__dirstream_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/local_file_system.cpp:674:71)>
               ::_M_invoke;
    local_d8 = std::
               _Function_handler<void_(__dirstream_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/local_file_system.cpp:674:71)>
               ::_M_manager;
    local_c8 = __dirp;
    while( true ) {
      pdVar4 = readdir(__dirp);
      if (pdVar4 == (dirent *)0x0) break;
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      sVar5 = strlen(pdVar4->d_name);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,pdVar4->d_name,pdVar4->d_name + sVar5);
      if (local_108._M_string_length != 0) {
        iVar2 = ::std::__cxx11::string::compare((char *)&local_108);
        if (iVar2 != 0) {
          iVar2 = ::std::__cxx11::string::compare((char *)&local_108);
          if (iVar2 != 0) {
            ::std::__cxx11::string::string((string *)&local_c0,local_130,&local_141);
            FileSystem::JoinPath(&local_128,local_138,(string *)&local_c0,&local_108);
            if ((__nlink_t *)local_c0.st_dev != &local_c0.st_nlink) {
              operator_delete((void *)local_c0.st_dev);
            }
            iVar2 = stat(local_128._M_dataplus._M_p,&local_c0);
            if ((iVar2 == 0) && ((local_c0.st_mode & 0xc000) != 0)) {
              local_141 = (allocator)((byte)(local_c0.st_mode >> 0xe) & 1);
              if (*(long *)(local_140 + 1) == 0) {
                ::std::__throw_bad_function_call();
              }
              (**(code **)(local_140->_M_pod_data + 0x18))(local_140,&local_108,(bool *)&local_141);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p);
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
    }
    std::unique_ptr<__dirstream,_std::function<void_(__dirstream_*)>_>::~unique_ptr
              ((unique_ptr<__dirstream,_std::function<void_(__dirstream_*)>_> *)&local_e8);
  }
  return __dirp != (DIR *)0x0;
}

Assistant:

bool LocalFileSystem::ListFiles(const string &directory, const std::function<void(const string &, bool)> &callback,
                                FileOpener *opener) {
	auto normalized_dir = NormalizeLocalPath(directory);
	auto dir = opendir(normalized_dir);
	if (!dir) {
		return false;
	}

	// RAII wrapper around DIR to automatically free on exceptions in callback
	std::unique_ptr<DIR, std::function<void(DIR *)>> dir_unique_ptr(dir, [](DIR *d) { closedir(d); });

	struct dirent *ent;
	// loop over all files in the directory
	while ((ent = readdir(dir)) != nullptr) {
		string name = string(ent->d_name);
		// skip . .. and empty files
		if (name.empty() || name == "." || name == "..") {
			continue;
		}
		// now stat the file to figure out if it is a regular file or directory
		string full_path = JoinPath(normalized_dir, name);
		struct stat status;
		auto res = stat(full_path.c_str(), &status);
		if (res != 0) {
			continue;
		}
		if (!(status.st_mode & S_IFREG) && !(status.st_mode & S_IFDIR)) {
			// not a file or directory: skip
			continue;
		}
		// invoke callback
		callback(name, status.st_mode & S_IFDIR);
	}

	return true;
}